

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall HighsSymmetryDetection::getOrbit(HighsSymmetryDetection *this,HighsInt vertex)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt orbit;
  HighsInt i;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  value_type vVar8;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long)in_ESI);
  iVar7 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long)iVar7);
  iVar4 = *pvVar3;
  iVar5 = iVar4;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long)iVar4);
  if (iVar4 != *pvVar3) {
    do {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,iVar7),
                 (value_type_conflict2 *)CONCAT44(iVar5,iVar4));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar5);
      iVar1 = *pvVar3;
      iVar6 = iVar1;
      iVar7 = iVar5;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)iVar1);
      iVar5 = iVar6;
    } while (iVar1 != *pvVar3);
    do {
      pvVar3 = std::vector<int,_std::allocator<int>_>::back(in_RDI);
      vVar8 = *pvVar3;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x6c6ff6);
      iVar5 = iVar6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)vVar8);
      *pvVar3 = iVar6;
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,vVar8));
      iVar6 = iVar5;
    } while (((bVar2 ^ 0xffU) & 1) != 0);
  }
  return iVar5;
}

Assistant:

HighsInt HighsSymmetryDetection::getOrbit(HighsInt vertex) {
  HighsInt i = vertexPosition[vertex];
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}